

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void inc_edx(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x20;
      }
      (pMyDisasm->Reserved_).REX.W_ = '\0';
      (pMyDisasm->Reserved_).REX.R_ = '\0';
      (pMyDisasm->Reserved_).REX.X_ = '\x01';
      (pMyDisasm->Reserved_).REX.B_ = '\0';
      (pMyDisasm->Reserved_).REX.state = '\x01';
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
      (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
      (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
      (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
      (*opcode_map1[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
  }
  else {
    if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
      (pMyDisasm->Prefix).LockPrefix = '\x01';
    }
    if ((pMyDisasm->Prefix).LockPrefix == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    (pMyDisasm->Instruction).Category = 0x10002;
    strcpy((pMyDisasm->Instruction).Mnemonic,"inc");
    if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[2]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = REGS[2];
      (pMyDisasm->Operand1).OpSize = 0x20;
      (pMyDisasm->Operand1).AccessMode = 3;
    }
    else {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[2]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = REGS[2];
      (pMyDisasm->Operand1).OpSize = 0x10;
      (pMyDisasm->Operand1).AccessMode = 3;
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x28);
  }
  return;
}

Assistant:

void __bea_callspec__ inc_edx(PDISASM pMyDisasm)
{
    if (GV.Architecture == 64) {
        if (!Security(2, pMyDisasm)) return;
        if (GV.REX.W_ == 1) GV.OperandSize = 32;
        GV.REX.W_ = 0;
        GV.REX.R_ = 0;
        GV.REX.X_ = 1;
        GV.REX.B_ = 0;
        GV.REX.state = InUsePrefix;
        GV.EIP_++;
        GV.NB_PREFIX++;
        pMyDisasm->Prefix.Number++;
        pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
        GV.OperandSize = 32;

    }
    else {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
          GV.ERROR_OPCODE = UD_;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "inc");
        #endif
        if (GV.OperandSize == 32) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[2]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[2+0];
            pMyDisasm->Operand1.OpSize = 32;
            pMyDisasm->Operand1.AccessMode = READ + WRITE;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[2]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[2+0];
            pMyDisasm->Operand1.OpSize = 16;
            pMyDisasm->Operand1.AccessMode = READ + WRITE;
        }
        GV.EIP_++;
        FillFlags(pMyDisasm, 40);
    }
}